

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_vectors.h
# Opt level: O2

void __thiscall
Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
write_to_file(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *this,char *filename)

{
  pointer pdVar1;
  ostream *poVar2;
  size_t i;
  long lVar3;
  ofstream out;
  
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)filename);
  for (lVar3 = 0;
      pdVar1 = (this->sorted_vector_of_distances).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start,
      lVar3 != (long)(this->sorted_vector_of_distances).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar1 >> 3; lVar3 = lVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(pdVar1[lVar3]);
    std::operator<<(poVar2," ");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void Vector_distances_in_diagram<F>::write_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  for (size_t i = 0; i != this->sorted_vector_of_distances.size(); ++i) {
    out << this->sorted_vector_of_distances[i] << " ";
  }

  out.close();
}